

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O2

char __thiscall avro::json::JsonParser::next(JsonParser *this)

{
  int iVar1;
  size_t in_RCX;
  void *__buf;
  ulong uVar2;
  int in_ESI;
  
  uVar2 = 0x20;
  if (this->hasNext != false) {
    uVar2 = (ulong)(byte)this->nextChar;
  }
  while( true ) {
    iVar1 = isspace((int)(char)uVar2);
    if (iVar1 == 0) break;
    uVar2 = StreamReader::read(&this->in_,in_ESI,__buf,in_RCX);
    uVar2 = uVar2 & 0xffffffff;
  }
  this->hasNext = false;
  return (char)uVar2;
}

Assistant:

char JsonParser::next()
{
    char ch = hasNext ? nextChar : ' ';
    while (isspace(ch)) {
        ch = in_.read();
    }
    hasNext = false;
    return ch;
}